

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlOutputBufferFlush(xmlOutputBufferPtr out)

{
  xmlOutputWriteCallback p_Var1;
  void *pvVar2;
  int iVar3;
  xmlChar *pxVar4;
  size_t sVar5;
  int local_20;
  int ret;
  int nbchars;
  xmlOutputBufferPtr out_local;
  
  local_20 = 0;
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
    out_local._4_4_ = -1;
  }
  else {
    if ((out->conv != (xmlBufPtr)0x0) && (out->encoder != (xmlCharEncodingHandlerPtr)0x0)) {
      do {
        iVar3 = xmlCharEncOutput(out,0);
        if (iVar3 < 0) {
          xmlIOErr(0x608,(char *)0x0);
          out->error = 0x608;
          return -1;
        }
      } while (iVar3 != 0);
    }
    if (((out->conv == (xmlBufPtr)0x0) || (out->encoder == (xmlCharEncodingHandlerPtr)0x0)) ||
       (out->writecallback == (xmlOutputWriteCallback)0x0)) {
      if (out->writecallback != (xmlOutputWriteCallback)0x0) {
        p_Var1 = out->writecallback;
        pvVar2 = out->context;
        pxVar4 = xmlBufContent(out->buffer);
        sVar5 = xmlBufUse(out->buffer);
        local_20 = (*p_Var1)(pvVar2,(char *)pxVar4,(int)sVar5);
        if (-1 < local_20) {
          xmlBufShrink(out->buffer,(long)local_20);
        }
      }
    }
    else {
      p_Var1 = out->writecallback;
      pvVar2 = out->context;
      pxVar4 = xmlBufContent(out->conv);
      sVar5 = xmlBufUse(out->conv);
      local_20 = (*p_Var1)(pvVar2,(char *)pxVar4,(int)sVar5);
      if (-1 < local_20) {
        xmlBufShrink(out->conv,(long)local_20);
      }
    }
    if (local_20 < 0) {
      xmlIOErr(0x609,(char *)0x0);
      out->error = 0x609;
      out_local._4_4_ = local_20;
    }
    else {
      if (0x7fffffff - local_20 < out->written) {
        out->written = 0x7fffffff;
      }
      else {
        out->written = local_20 + out->written;
      }
      out_local._4_4_ = local_20;
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlOutputBufferFlush(xmlOutputBufferPtr out) {
    int nbchars = 0, ret = 0;

    if ((out == NULL) || (out->error)) return(-1);
    /*
     * first handle encoding stuff.
     */
    if ((out->conv != NULL) && (out->encoder != NULL)) {
	/*
	 * convert as much as possible to the parser output buffer.
	 */
	do {
	    nbchars = xmlCharEncOutput(out, 0);
	    if (nbchars < 0) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
	} while (nbchars);
    }

    /*
     * second flush the stuff to the I/O channel
     */
    if ((out->conv != NULL) && (out->encoder != NULL) &&
	(out->writecallback != NULL)) {
	ret = out->writecallback(out->context,
                                 (const char *)xmlBufContent(out->conv),
                                 xmlBufUse(out->conv));
	if (ret >= 0)
	    xmlBufShrink(out->conv, ret);
    } else if (out->writecallback != NULL) {
	ret = out->writecallback(out->context,
                                 (const char *)xmlBufContent(out->buffer),
                                 xmlBufUse(out->buffer));
	if (ret >= 0)
	    xmlBufShrink(out->buffer, ret);
    }
    if (ret < 0) {
	xmlIOErr(XML_IO_FLUSH, NULL);
	out->error = XML_IO_FLUSH;
	return(ret);
    }
    if (out->written > INT_MAX - ret)
        out->written = INT_MAX;
    else
        out->written += ret;

#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: flushed %d chars\n", ret);
#endif
    return(ret);
}